

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

ssize_t __thiscall
kj::AsyncInputStream::read(AsyncInputStream *this,int __fd,void *__buf,size_t __nbytes)

{
  PromiseNode *pPVar1;
  TransformPromiseNodeBase *this_00;
  undefined4 in_register_00000034;
  Own<kj::_::PromiseNode> local_30;
  
  (**(code **)(*(long *)CONCAT44(in_register_00000034,__fd) + 8))(&local_30);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x38);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,&local_30,
             _::
             TransformPromiseNode<unsigned_long,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:57:51),_kj::_::PropagateException>
             ::anon_class_16_2_928cd080_for_func::operator());
  pPVar1 = local_30.ptr;
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00449d98;
  this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)__nbytes;
  this_00[1].dependency.disposer = (Disposer *)__buf;
  this->_vptr_AsyncInputStream =
       (_func_int **)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<unsigned_long,unsigned_long,kj::AsyncInputStream::read(void*,unsigned_long,unsigned_long)::$_0,kj::_::PropagateException>>
        ::instance;
  this[1]._vptr_AsyncInputStream = (_func_int **)this_00;
  if (local_30.ptr != (PromiseNode *)0x0) {
    local_30.ptr = (PromiseNode *)0x0;
    (**(local_30.disposer)->_vptr_Disposer)
              (local_30.disposer,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
  }
  return (ssize_t)this;
}

Assistant:

Promise<size_t> AsyncInputStream::read(void* buffer, size_t minBytes, size_t maxBytes) {
  return tryRead(buffer, minBytes, maxBytes).then([=](size_t result) {
    if (result >= minBytes) {
      return result;
    } else {
      kj::throwRecoverableException(KJ_EXCEPTION(DISCONNECTED, "stream disconnected prematurely"));
      // Pretend we read zeros from the input.
      memset(reinterpret_cast<byte*>(buffer) + result, 0, minBytes - result);
      return minBytes;
    }
  });
}